

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O2

Vec_Wrd_t * Vec_WrdUniqifyHash(Vec_Wrd_t *vData,int nWordSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__s;
  void *__s_00;
  int *piVar6;
  int *piVar7;
  long *plVar8;
  long *plVar9;
  Vec_Int_t *p;
  Vec_Wrd_t *p_00;
  byte bVar10;
  int c;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int i;
  long lVar15;
  uint uVar16;
  size_t __size;
  int local_48;
  
  lVar15._0_4_ = vData->nCap;
  lVar15._4_4_ = vData->nSize;
  vData->nCap = (undefined4)lVar15 * 2;
  vData->nSize = lVar15._4_4_ * 2;
  bVar10 = (byte)lVar15._4_4_;
  if (1 < (uint)lVar15._4_4_) {
    bVar10 = 0;
    for (uVar16 = lVar15._4_4_ - 1; uVar16 != 0; uVar16 = uVar16 >> 1) {
      bVar10 = bVar10 + 1;
    }
  }
  iVar3 = 1 << (bVar10 & 0x1f);
  __size = (long)iVar3 << 2;
  __s = malloc(__size);
  memset(__s,0xff,__size);
  __s_00 = malloc(__size);
  memset(__s_00,0xff,__size);
  piVar6 = (int *)malloc((long)(int)lVar15._4_4_ << 2);
  uVar14 = 0;
  uVar12 = 0;
  if (lVar15._4_4_ != 0 && -1 < lVar15) {
    uVar12 = (ulong)(uint)lVar15._4_4_;
  }
  iVar4 = 0;
  do {
    if (uVar14 == uVar12) {
      free(__s);
      free(__s_00);
      p = (Vec_Int_t *)malloc(0x10);
      p->nSize = lVar15._4_4_;
      p->nCap = lVar15._4_4_;
      p->pArray = piVar6;
      p_00 = (Vec_Wrd_t *)Vec_IntAlloc(iVar4 * 2);
      iVar3 = 0;
      do {
        local_48 = (int)uVar12;
        if (iVar3 == local_48) {
          if (p_00->nSize != iVar4 * 2) {
            __assert_fail("Vec_IntSize(vUnique) == nUnique * nIntSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x64d,"Vec_Int_t *Vec_IntUniqifyHash(Vec_Int_t *, int)");
          }
          Vec_IntFree(p);
          uVar1 = vData->nCap;
          uVar2 = vData->nSize;
          vData->nCap = (int)uVar1 / 2;
          vData->nSize = (int)uVar2 / 2;
          p_00->nSize = iVar4;
          p_00->nCap = p_00->nCap / 2;
          return p_00;
        }
        iVar5 = Vec_IntEntry(p,iVar3);
        if (iVar3 <= iVar5) {
          if (iVar5 != iVar3) {
            __assert_fail("Ent == i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x64a,"Vec_Int_t *Vec_IntUniqifyHash(Vec_Int_t *, int)");
          }
          piVar6 = Vec_IntEntryP((Vec_Int_t *)vData,iVar3 * 2);
          for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
            Vec_IntPush((Vec_Int_t *)p_00,piVar6[lVar15]);
          }
        }
        iVar3 = iVar3 + 1;
      } while( true );
    }
    iVar5 = (int)uVar14;
    piVar7 = Vec_IntEntryP((Vec_Int_t *)vData,iVar5 * 2);
    uVar16 = 0;
    for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
      uVar16 = *(int *)(Vec_IntUniqueHashKey_s_BigPrimes +
                       (ulong)(*(byte *)((long)piVar7 + lVar13) & 0xf) * 4) *
               (&Vec_IntUniqueHashKey_s_BigPrimes2)[lVar13 * 2] + uVar16 +
               *(int *)(Vec_IntUniqueHashKey_s_BigPrimes +
                       (ulong)(*(byte *)((long)piVar7 + lVar13) >> 4) * 4) *
               (&DAT_00856e14)[lVar13 * 2];
    }
    plVar8 = (long *)Vec_IntEntryP((Vec_Int_t *)vData,iVar5 * 2);
    piVar7 = (int *)((long)__s + (long)(int)(uVar16 & iVar3 - 1U) * 4);
    while (*piVar7 != -1) {
      plVar9 = (long *)Vec_IntEntryP((Vec_Int_t *)vData,*piVar7 * 2);
      iVar11 = *piVar7;
      if (*plVar8 == *plVar9) {
        if (iVar11 != -1) goto LAB_005f4f31;
        break;
      }
      piVar7 = (int *)((long)__s_00 + (long)iVar11 * 4);
    }
    *piVar7 = iVar5;
    iVar4 = iVar4 + 1;
    iVar11 = iVar5;
LAB_005f4f31:
    piVar6[uVar14] = iVar11;
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdUniqifyHash( Vec_Wrd_t * vData, int nWordSize )
{
    Vec_Int_t * vResInt;
    Vec_Int_t * vDataInt = (Vec_Int_t *)vData;
    vDataInt->nSize *= 2;
    vDataInt->nCap *= 2;
    vResInt = Vec_IntUniqifyHash( vDataInt, 2 * nWordSize );
    vDataInt->nSize /= 2;
    vDataInt->nCap /= 2;
    vResInt->nSize /= 2;
    vResInt->nCap /= 2;
    return (Vec_Wrd_t *)vResInt;
}